

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

bool __thiscall Matrix::Inverse(Matrix *this,ChoiceType choice_type)

{
  bool bVar1;
  Fraction local_48;
  undefined1 local_40 [8];
  Matrix result;
  ChoiceType choice_type_local;
  Matrix *this_local;
  
  result.elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = choice_type;
  GetInverse((Matrix *)local_40,this,choice_type);
  Fraction::Fraction(&local_48,0);
  bVar1 = operator==((Matrix *)local_40,&local_48);
  if (!bVar1) {
    operator=(this,(Matrix *)local_40);
  }
  this_local._7_1_ = !bVar1;
  ~Matrix((Matrix *)local_40);
  return this_local._7_1_;
}

Assistant:

bool Matrix::Inverse(Options::ChoiceType choice_type) {
  Matrix result = GetInverse(choice_type);
  if (result == 0) {
    return false;
  } else {
    operator=(result);
    return true;
  }
}